

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawImage.cpp
# Opt level: O3

void drawImage2(Array2D<half> *gpx,Array2D<float> *zpx,int w,int h)

{
  long lVar1;
  float fVar2;
  float fVar3;
  unsigned_short uVar4;
  int iVar5;
  uint uVar6;
  float *pfVar7;
  long lVar8;
  long lVar9;
  half *phVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  float p;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float xl;
  
  if (0 < h) {
    lVar9 = gpx->_sizeY;
    phVar10 = gpx->_data;
    lVar12 = zpx->_sizeY;
    pfVar7 = zpx->_data;
    uVar11 = 0;
    do {
      if (0 < w) {
        uVar13 = 0;
        do {
          phVar10[uVar13]._h = 0;
          pfVar7[uVar13] = 3.4028235e+38;
          uVar13 = uVar13 + 1;
        } while ((uint)w != uVar13);
      }
      uVar11 = uVar11 + 1;
      pfVar7 = pfVar7 + lVar12;
      phVar10 = phVar10 + lVar9;
    } while (uVar11 != (uint)h);
  }
  fVar14 = (float)w;
  fVar27 = (float)h + -1.0;
  iVar5 = 0;
  do {
    dVar20 = (double)(((float)(iVar5 * 2) * 3.1415927) / 2000.0);
    dVar21 = sin(dVar20 * 4.0);
    dVar22 = dVar20 * 15.0;
    dVar23 = sin(dVar22);
    dVar24 = cos(dVar20 * 3.0);
    dVar25 = cos(dVar22);
    dVar20 = sin(dVar20 * 5.0);
    dVar22 = sin(dVar22);
    fVar2 = (float)dVar20 * -0.5 + 0.5 + 0.2;
    fVar29 = ((float)(dVar23 * 0.2 + dVar21) * fVar14) / 3.0 + (float)(w / 2);
    fVar3 = (float)(dVar22 * 0.3 + 0.7) * fVar14 * 0.05;
    fVar15 = floorf(fVar29 - fVar3);
    fVar30 = 0.0;
    if (0.0 <= fVar15) {
      fVar30 = fVar15;
    }
    fVar16 = ceilf(fVar29 + fVar3);
    fVar15 = fVar14 + -1.0;
    if (fVar16 <= fVar14 + -1.0) {
      fVar15 = fVar16;
    }
    if ((int)fVar30 <= (int)fVar15) {
      fVar17 = ((float)(dVar25 * 0.2 + dVar24) * (float)h) / 3.0 + (float)(h / 2);
      fVar18 = ceilf(fVar17 + fVar3);
      fVar16 = fVar27;
      if (fVar18 <= fVar27) {
        fVar16 = fVar18;
      }
      fVar19 = floorf(fVar17 - fVar3);
      fVar18 = 0.0;
      if (0.0 <= fVar19) {
        fVar18 = fVar19;
      }
      lVar9 = (long)(int)fVar30;
      do {
        if ((int)fVar18 <= (int)fVar16) {
          fVar30 = ((float)(int)lVar9 - fVar29) / fVar3;
          lVar12 = (long)(int)fVar18;
          do {
            fVar28 = ((float)(int)lVar12 - fVar17) / fVar3;
            fVar19 = SQRT(fVar30 * fVar30 + fVar28 * fVar28);
            if (fVar19 < 1.0) {
              fVar19 = 1.0 - fVar19 * fVar19;
              if (fVar19 < 0.0) {
                fVar19 = sqrtf(fVar19);
              }
              else {
                fVar19 = SQRT(fVar19);
              }
              fVar31 = -fVar3 * fVar19 + (float)dVar20 * fVar14 + (float)(w * 3);
              pfVar7 = zpx->_data;
              lVar8 = zpx->_sizeY * lVar12;
              if (fVar31 < pfVar7[lVar8 + lVar9]) {
                fVar19 = fVar19 * 0.7071 + fVar30 * 0.42426 + fVar28 * -0.56568;
                fVar19 = (float)(-(uint)(fVar19 < 0.0) & (uint)(fVar19 * -0.1) |
                                ~-(uint)(fVar19 < 0.0) & (uint)fVar19);
                uVar11 = 0x32;
                fVar26 = 1.0;
                fVar28 = fVar19;
                do {
                  if ((uVar11 & 1) != 0) {
                    fVar26 = fVar26 * fVar28;
                  }
                  fVar28 = fVar28 * fVar28;
                  uVar6 = (uint)uVar11;
                  uVar11 = uVar11 >> 1;
                } while (1 < uVar6);
                fVar19 = (fVar19 + fVar26 * 4.0) * fVar2 * 2.5 * fVar2;
                lVar1 = gpx->_sizeY;
                phVar10 = gpx->_data;
                if ((fVar19 != 0.0) || (NAN(fVar19))) {
                  if (half::_eLut[(uint)fVar19 >> 0x17] == 0) {
                    uVar4 = half::convert((int)fVar19);
                    pfVar7 = zpx->_data;
                    lVar8 = zpx->_sizeY * lVar12;
                  }
                  else {
                    uVar4 = half::_eLut[(uint)fVar19 >> 0x17] +
                            (short)(((uint)fVar19 & 0x7fffff) + 0xfff +
                                    (uint)(((uint)fVar19 >> 0xd & 1) != 0) >> 0xd);
                  }
                }
                else {
                  uVar4 = (unsigned_short)((uint)fVar19 >> 0x10);
                }
                phVar10[lVar1 * lVar12 + lVar9]._h = uVar4;
                pfVar7[lVar8 + lVar9] = fVar31;
              }
            }
            lVar12 = lVar12 + 1;
          } while ((int)fVar16 + 1 != (int)lVar12);
        }
        lVar9 = lVar9 + 1;
      } while ((int)fVar15 + 1 != (int)lVar9);
    }
    iVar5 = iVar5 + 1;
  } while (iVar5 != 2000);
  return;
}

Assistant:

void
drawImage2 (Array2D<half> &gpx, Array2D<float> &zpx, int w, int h)
{
    for (int y = 0; y < h; ++y)
    {
	for (int x = 0; x < w; ++x)
	{
	    gpx[y][x] = 0;
	    zpx[y][x] = FLT_MAX;
	}
    }

    int n = 2000;

    for (int i = 0; i < n; ++i)
    {
	float t = (i * 2.0 * M_PI) / n;
	float xp = sin (t * 4.0) + 0.2 * sin (t * 15.0);
	float yp = cos (t * 3.0) + 0.2 * cos (t * 15.0);
	float zp = sin (t * 5.0);
	float rd = 0.7 + 0.3 * sin (t * 15.0);
	float gn = 0.5 - 0.5 * zp + 0.2;

	zsp (gpx, zpx, w, h,
	     xp * w / 3 + w / 2,
	     yp * h / 3 + h / 2,
	     zp * w + 3 * w,
	     w * rd * 0.05,
	     2.5 * gn * gn);
    }
}